

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skeleton.cpp
# Opt level: O2

void __thiscall CMU462::DynamicScene::Skeleton::save(Skeleton *this,char *filename)

{
  XMLError XVar1;
  ostream *poVar2;
  XMLElement *parentNode;
  XMLDocument xmlDoc;
  
  poVar2 = std::operator<<((ostream *)&std::cerr,"Writing skeleton to file ");
  poVar2 = std::operator<<(poVar2,filename);
  std::endl<char,std::char_traits<char>>(poVar2);
  tinyxml2::XMLDocument::XMLDocument(&xmlDoc,true,PRESERVE_WHITESPACE);
  parentNode = tinyxml2::XMLDocument::NewElement(&xmlDoc,"Skeleton");
  tinyxml2::XMLNode::InsertFirstChild(&xmlDoc.super_XMLNode,&parentNode->super_XMLNode);
  saveJoint(this,&xmlDoc,parentNode,this->root);
  XVar1 = tinyxml2::XMLDocument::SaveFile(&xmlDoc,filename,false);
  if (XVar1 != XML_NO_ERROR) {
    printf("Error: %i\n",(ulong)XVar1);
  }
  tinyxml2::XMLDocument::~XMLDocument(&xmlDoc);
  return;
}

Assistant:

void Skeleton::save(const char * filename)
   {
     cerr << "Writing skeleton to file " << filename << endl;
     XMLDocument xmlDoc;
     XMLElement* pRoot = xmlDoc.NewElement("Skeleton");
     xmlDoc.InsertFirstChild(pRoot);

     saveJoint(&xmlDoc, pRoot, root);

     XMLError eResult = xmlDoc.SaveFile(filename);
     XMLCheckResult(eResult);
   }